

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_tests.cpp
# Opt level: O3

void __thiscall
serialize_tests::with_params_vector_of_base::test_method(with_params_vector_of_base *this)

{
  undefined1 *puVar1;
  int iVar2;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  long in_FS_OFFSET;
  initializer_list<serialize_tests::Base> __l;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  char *local_1d8;
  char *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  char *local_178;
  char *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  char *local_158;
  char *local_150;
  lazy_ostream local_148;
  undefined1 *local_138;
  char *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  char *local_118;
  char *local_110;
  DataStream stream;
  vector<serialize_tests::Base,_std::allocator<serialize_tests::Base>_> v;
  undefined1 local_d0 [24];
  assertion_result local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  undefined **local_98;
  undefined1 local_90;
  undefined1 *local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_80;
  ParamsStream<DataStream_&,_serialize_tests::BaseFormat> local_78;
  undefined1 *local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78.m_params = (BaseFormat *)CONCAT62(local_78.m_params._2_6_,0xff0f);
  __l._M_len = 2;
  __l._M_array = (iterator)&local_78;
  std::vector<serialize_tests::Base,_std::allocator<serialize_tests::Base>_>::vector
            (&v,__l,(allocator_type *)&local_98);
  local_78.m_substream = &stream;
  stream.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  stream.m_read_pos = 0;
  stream.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  stream.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.m_params = (BaseFormat *)&RAW;
  VectorFormatter<DefaultFormatter>::
  Ser<ParamsStream<DataStream&,serialize_tests::BaseFormat>,std::vector<serialize_tests::Base,std::allocator<serialize_tests::Base>>>
            ((VectorFormatter<DefaultFormatter> *)&local_98,&local_78,&v);
  local_118 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_110 = "";
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x1cb;
  file.m_begin = (iterator)&local_118;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_128,msg);
  local_148.m_empty = false;
  local_148._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_138 = boost::unit_test::lazy_ostream::inst;
  local_130 = "";
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<unsigned_char_const*>
            ((string *)&local_58,
             stream.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
             .super__Vector_impl_data._M_start + stream.m_read_pos,
             stream.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
             .super__Vector_impl_data._M_finish);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_58,anon_var_dwarf_16a0ac0);
  local_b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar2 == 0);
  local_b8.m_message.px = (element_type *)0x0;
  local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  puVar1 = local_d0 + 8;
  local_d0._8_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_d0._16_8_ =
       (long)
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
       + 0x61;
  local_60 = &local_a0;
  local_78.m_substream = (DataStream *)((ulong)local_78.m_substream & 0xffffffffffffff00);
  local_78.m_params = (BaseFormat *)&PTR__lazy_ostream_013ae148;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_d0;
  local_d0._0_8_ = anon_var_dwarf_16a0ac0;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_013ae898;
  local_88 = boost::unit_test::lazy_ostream::inst;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_a0 = &local_58;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_148,1,2,REQUIRE,0xf10851,(size_t)puVar1,0x1cb,&local_78,
             "\"\\x02\\x0F\\xFF\"",(VectorFormatter<DefaultFormatter> *)&local_98);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  *(undefined2 *)
   v.super__Vector_base<serialize_tests::Base,_std::allocator<serialize_tests::Base>_>._M_impl.
   super__Vector_impl_data._M_start = 0;
  local_78.m_params = (BaseFormat *)&RAW;
  local_78.m_substream = &stream;
  VectorFormatter<DefaultFormatter>::
  Unser<ParamsStream<DataStream&,serialize_tests::BaseFormat>,std::vector<serialize_tests::Base,std::allocator<serialize_tests::Base>>>
            ((VectorFormatter<DefaultFormatter> *)&local_98,&local_78,&v);
  local_158 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_150 = "";
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x1d0;
  file_00.m_begin = (iterator)&local_158;
  msg_00.m_end = pvVar4;
  msg_00.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_168,
             msg_00);
  local_148.m_empty = false;
  local_148._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_138 = boost::unit_test::lazy_ostream::inst;
  local_130 = "";
  local_d0._0_4_ = 0xf;
  local_58._M_string_length = 0;
  local_58.field_2._M_allocated_capacity = 0;
  local_b8._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_b8.m_message.px = (element_type *)0xf10351;
  local_d0._8_8_ =
       v.super__Vector_base<serialize_tests::Base,_std::allocator<serialize_tests::Base>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_78.m_substream = (DataStream *)((ulong)local_78.m_substream & 0xffffffffffffff00);
  local_78.m_params = (BaseFormat *)&PTR__lazy_ostream_013aee50;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_013ae248;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = &local_a0;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)puVar1;
  local_58._M_dataplus._M_p._0_1_ =
       (v.super__Vector_base<serialize_tests::Base,_std::allocator<serialize_tests::Base>_>._M_impl.
        super__Vector_impl_data._M_start)->m_base_data == '\x0f';
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_58,&local_148,1,2,REQUIRE,0xf10920,(size_t)&local_b8,0x1d0,
             &local_78,"0x0F",(VectorFormatter<DefaultFormatter> *)&local_98);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_58.field_2._M_allocated_capacity);
  local_178 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_170 = "";
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x1d1;
  file_01.m_begin = (iterator)&local_178;
  msg_01.m_end = pvVar4;
  msg_01.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_188,
             msg_01);
  local_148.m_empty = false;
  local_148._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_138 = boost::unit_test::lazy_ostream::inst;
  local_130 = "";
  local_d0._0_4_ = 0xff;
  local_58._M_dataplus._M_p._0_1_ =
       v.super__Vector_base<serialize_tests::Base,_std::allocator<serialize_tests::Base>_>._M_impl.
       super__Vector_impl_data._M_start[1].m_base_data == 0xff;
  local_d0._8_8_ =
       v.super__Vector_base<serialize_tests::Base,_std::allocator<serialize_tests::Base>_>._M_impl.
       super__Vector_impl_data._M_start + 1;
  local_58._M_string_length = 0;
  local_58.field_2._M_allocated_capacity = 0;
  local_b8._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_b8.m_message.px = (element_type *)0xf10351;
  local_78.m_substream = (DataStream *)((ulong)local_78.m_substream & 0xffffffffffffff00);
  local_78.m_params = (BaseFormat *)&PTR__lazy_ostream_013aee50;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_013ae248;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = &local_a0;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)puVar1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_58,&local_148,1,2,REQUIRE,0xf10931,(size_t)&local_b8,0x1d1,
             &local_78,"0xFF",(VectorFormatter<DefaultFormatter> *)&local_98);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_58.field_2._M_allocated_capacity);
  if (stream.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      stream.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start) {
    stream.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish =
         stream.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  stream.m_read_pos = 0;
  local_78.m_params = (BaseFormat *)&HEX;
  local_78.m_substream = &stream;
  VectorFormatter<DefaultFormatter>::
  Ser<ParamsStream<DataStream&,serialize_tests::BaseFormat>,std::vector<serialize_tests::Base,std::allocator<serialize_tests::Base>>>
            ((VectorFormatter<DefaultFormatter> *)&local_98,&local_78,&v);
  local_198 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_190 = "";
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x1d7;
  file_02.m_begin = (iterator)&local_198;
  msg_02.m_end = pvVar4;
  msg_02.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1a8,
             msg_02);
  local_148.m_empty = false;
  local_148._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_138 = boost::unit_test::lazy_ostream::inst;
  local_130 = "";
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<unsigned_char_const*>
            ((string *)&local_58,
             stream.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
             .super__Vector_impl_data._M_start + stream.m_read_pos,
             stream.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
             .super__Vector_impl_data._M_finish);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_58,"\x020fff");
  local_b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar2 == 0);
  local_b8.m_message.px = (element_type *)0x0;
  local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  puVar1 = local_d0 + 8;
  local_d0._8_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_d0._16_8_ =
       (long)
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
       + 0x61;
  local_78.m_substream = (DataStream *)((ulong)local_78.m_substream & 0xffffffffffffff00);
  local_78.m_params = (BaseFormat *)&PTR__lazy_ostream_013ae148;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = &local_a0;
  local_d0._0_8_ = "\x020fff";
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_013ae618;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_d0;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_a0 = &local_58;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_148,1,2,REQUIRE,0xf10851,(size_t)puVar1,0x1d7,&local_78,
             "\"\\x02\" \"0fff\"",(VectorFormatter<DefaultFormatter> *)&local_98);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  *(undefined2 *)
   v.super__Vector_base<serialize_tests::Base,_std::allocator<serialize_tests::Base>_>._M_impl.
   super__Vector_impl_data._M_start = 0;
  local_78.m_params = (BaseFormat *)&HEX;
  local_78.m_substream = &stream;
  VectorFormatter<DefaultFormatter>::
  Unser<ParamsStream<DataStream&,serialize_tests::BaseFormat>,std::vector<serialize_tests::Base,std::allocator<serialize_tests::Base>>>
            ((VectorFormatter<DefaultFormatter> *)&local_98,&local_78,&v);
  local_1b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_1b0 = "";
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x1dc;
  file_03.m_begin = (iterator)&local_1b8;
  msg_03.m_end = pvVar4;
  msg_03.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_1c8,
             msg_03);
  local_148.m_empty = false;
  local_148._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_138 = boost::unit_test::lazy_ostream::inst;
  local_130 = "";
  local_d0._0_4_ = 0xf;
  local_58._M_string_length = 0;
  local_58.field_2._M_allocated_capacity = 0;
  local_b8._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_b8.m_message.px = (element_type *)0xf10351;
  local_d0._8_8_ =
       v.super__Vector_base<serialize_tests::Base,_std::allocator<serialize_tests::Base>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_78.m_substream = (DataStream *)((ulong)local_78.m_substream & 0xffffffffffffff00);
  local_78.m_params = (BaseFormat *)&PTR__lazy_ostream_013aee50;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_013ae248;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = &local_a0;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)puVar1;
  local_58._M_dataplus._M_p._0_1_ =
       (v.super__Vector_base<serialize_tests::Base,_std::allocator<serialize_tests::Base>_>._M_impl.
        super__Vector_impl_data._M_start)->m_base_data == '\x0f';
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_58,&local_148,1,2,REQUIRE,0xf10920,(size_t)&local_b8,0x1dc,
             &local_78,"0x0F",(VectorFormatter<DefaultFormatter> *)&local_98);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_58.field_2._M_allocated_capacity);
  local_1d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_1d0 = "";
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x1dd;
  file_04.m_begin = (iterator)&local_1d8;
  msg_04.m_end = pvVar4;
  msg_04.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_1e8,
             msg_04);
  local_148.m_empty = false;
  local_148._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_138 = boost::unit_test::lazy_ostream::inst;
  local_130 = "";
  local_d0._0_4_ = 0xff;
  local_58._M_dataplus._M_p._0_1_ =
       v.super__Vector_base<serialize_tests::Base,_std::allocator<serialize_tests::Base>_>._M_impl.
       super__Vector_impl_data._M_start[1].m_base_data == 0xff;
  local_d0._8_8_ =
       v.super__Vector_base<serialize_tests::Base,_std::allocator<serialize_tests::Base>_>._M_impl.
       super__Vector_impl_data._M_start + 1;
  local_58._M_string_length = 0;
  local_58.field_2._M_allocated_capacity = 0;
  local_b8._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_b8.m_message.px = (element_type *)0xf10351;
  local_78.m_substream = (DataStream *)((ulong)local_78.m_substream & 0xffffffffffffff00);
  local_78.m_params = (BaseFormat *)&PTR__lazy_ostream_013aee50;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_013ae248;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = &local_a0;
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)puVar1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_58,&local_148,1,2,REQUIRE,0xf10931,(size_t)&local_b8,0x1dd,
             &local_78,"0xFF",(VectorFormatter<DefaultFormatter> *)&local_98);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_58.field_2._M_allocated_capacity);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&stream);
  if (v.super__Vector_base<serialize_tests::Base,_std::allocator<serialize_tests::Base>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(v.
                    super__Vector_base<serialize_tests::Base,_std::allocator<serialize_tests::Base>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)v.
                          super__Vector_base<serialize_tests::Base,_std::allocator<serialize_tests::Base>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)v.
                          super__Vector_base<serialize_tests::Base,_std::allocator<serialize_tests::Base>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(with_params_vector_of_base)
{
    std::vector<Base> v{Base{0x0F}, Base{0xFF}};

    DataStream stream;

    stream << RAW(v);
    BOOST_CHECK_EQUAL(stream.str(), "\x02\x0F\xFF");

    v[0].m_base_data = 0;
    v[1].m_base_data = 0;
    stream >> RAW(v);
    BOOST_CHECK_EQUAL(v[0].m_base_data, 0x0F);
    BOOST_CHECK_EQUAL(v[1].m_base_data, 0xFF);

    stream.clear();

    stream << HEX(v);
    BOOST_CHECK_EQUAL(stream.str(), "\x02"
                                    "0fff");

    v[0].m_base_data = 0;
    v[1].m_base_data = 0;
    stream >> HEX(v);
    BOOST_CHECK_EQUAL(v[0].m_base_data, 0x0F);
    BOOST_CHECK_EQUAL(v[1].m_base_data, 0xFF);
}